

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this)

{
  cmLocalGenerator *pcVar1;
  pointer puVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  pointer puVar6;
  __uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> this_00;
  pointer puVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string fname;
  cmGeneratedFileStream fout;
  string local_2e0;
  pointer local_2c0;
  string local_2b8;
  undefined1 local_298 [16];
  undefined8 local_288;
  char *local_280;
  
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  local_298._8_8_ = (psVar4->_M_dataplus)._M_p;
  local_298._0_8_ = psVar4->_M_string_length;
  local_288 = 0x21;
  local_280 = "/CMakeFiles/TargetDirectories.txt";
  views._M_len = 2;
  views._M_array = (iterator)local_298;
  cmCatViews_abi_cxx11_(&local_2b8,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_2b8,false,None);
  puVar7 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2c0 = (this->LocalGenerators).
              super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != local_2c0) {
    do {
      pcVar1 = (puVar7->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      puVar2 = *(pointer *)
                ((long)&(pcVar1->GeneratorTargets).
                        super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                + 8);
      for (puVar6 = *(pointer *)
                     &(pcVar1->GeneratorTargets).
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                      ._M_impl; puVar6 != puVar2; puVar6 = puVar6 + 1) {
        this_00._M_t.
        super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
        super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
             (puVar6->_M_t).
             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t;
        bVar3 = cmGeneratorTarget::IsInBuildSystem
                          ((cmGeneratorTarget *)
                           this_00._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (bVar3) {
          WriteSummary((cmGlobalGenerator *)
                       this_00._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                       (cmGeneratorTarget *)
                       (puVar6->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                      );
          cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                    (&local_2e0,
                     (cmGeneratorTarget *)
                     (puVar6->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                    );
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,local_2e0._M_dataplus._M_p,
                              local_2e0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != local_2c0);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary()
{
  // Record all target directories in a central location.
  std::string fname = cmStrCat(this->CMakeInstance->GetHomeOutputDirectory(),
                               "/CMakeFiles/TargetDirectories.txt");
  cmGeneratedFileStream fout(fname);

  for (const auto& lg : this->LocalGenerators) {
    for (const auto& tgt : lg->GetGeneratorTargets()) {
      if (!tgt->IsInBuildSystem()) {
        continue;
      }
      this->WriteSummary(tgt.get());
      fout << tgt->GetSupportDirectory() << "\n";
    }
  }
}